

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqResWithDeletion.cpp
# Opt level: O0

bool __thiscall Shell::EqResWithDeletion::apply(EqResWithDeletion *this,UnitList **units)

{
  bool bVar1;
  Clause *pCVar2;
  List<Kernel::Unit_*> **in_RSI;
  Unit *in_RDI;
  Clause *cl2;
  Clause *cl;
  DelIterator uit;
  bool modified;
  Clause *in_stack_00000160;
  EqResWithDeletion *in_stack_00000168;
  Clause *in_stack_ffffffffffffffc0;
  DelIterator local_30;
  byte local_11;
  
  local_11 = 0;
  Lib::List<Kernel::Unit_*>::DelIterator::DelIterator(&local_30,in_RSI);
  while (bVar1 = Lib::List<Kernel::Unit_*>::DelIterator::hasNext((DelIterator *)in_RDI), bVar1) {
    pCVar2 = (Clause *)
             Lib::List<Kernel::Unit_*>::DelIterator::next((DelIterator *)in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 = apply(in_stack_00000168,in_stack_00000160);
    if (pCVar2 != in_stack_ffffffffffffffc0) {
      local_11 = 1;
      Lib::List<Kernel::Unit_*>::DelIterator::replace
                ((DelIterator *)in_stack_ffffffffffffffc0,in_RDI);
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool EqResWithDeletion::apply(UnitList*& units)
{
  bool modified = false;

  UnitList::DelIterator uit(units);
  while(uit.hasNext()) {
    Clause* cl=static_cast<Clause*>(uit.next());
    ASS(cl->isClause());
    Clause* cl2=apply(cl);
    if(cl!=cl2) {
      modified = true;
      uit.replace(cl2);
    }
  }
  return modified;
}